

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestMessageWithCustomOptions::clear_AnOneof(TestMessageWithCustomOptions *this)

{
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestMessageWithCustomOptions::clear_AnOneof() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestMessageWithCustomOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (AnOneof_case()) {
    case kOneofField: {
      // No need to clear
      break;
    }
    case ANONEOF_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ANONEOF_NOT_SET;
}